

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::WritePrefixBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  size_t size;
  StackVar *in_RCX;
  char (*in_R8) [3];
  Newline *in_R9;
  Opcode local_8c;
  char local_88 [12];
  StackVar local_7c;
  Info local_70;
  
  local_8c.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_70,&local_8c);
  local_70.name._0_4_ = 1;
  local_70._4_8_ = local_70.result_type;
  local_7c.index = 1;
  local_7c.type.enum_ = Any;
  local_7c.type.type_index_ = 0;
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  Write(this,(StackVar *)&local_70);
  WriteData(this," = ",3);
  size = strlen(op);
  WriteData(this,op,size);
  WriteData(this,"(",1);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_7c,(char (*) [3])local_88,in_RCX,in_R8,in_R9);
  DropTypes(this,2);
  PushType(this,local_70.result_type);
  return;
}

Assistant:

void CWriter::WritePrefixBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type), " = ", op, "(", StackVar(1), ", ",
        StackVar(0), ");", Newline());
  DropTypes(2);
  PushType(result_type);
}